

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 in_ZMM18 [64];
  undefined1 auVar49 [64];
  ulong local_2348;
  undefined4 local_2340 [2];
  ulong local_2338 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2348 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2340[0] = 0;
    fVar1 = (query->p).field_0.field_0.x;
    auVar37._4_4_ = fVar1;
    auVar37._0_4_ = fVar1;
    auVar37._8_4_ = fVar1;
    auVar37._12_4_ = fVar1;
    auVar37._16_4_ = fVar1;
    auVar37._20_4_ = fVar1;
    auVar37._24_4_ = fVar1;
    auVar37._28_4_ = fVar1;
    fVar2 = (query->p).field_0.field_0.y;
    auVar38._4_4_ = fVar2;
    auVar38._0_4_ = fVar2;
    auVar38._8_4_ = fVar2;
    auVar38._12_4_ = fVar2;
    auVar38._16_4_ = fVar2;
    auVar38._20_4_ = fVar2;
    auVar38._24_4_ = fVar2;
    auVar38._28_4_ = fVar2;
    fVar3 = (query->p).field_0.field_0.z;
    auVar39._4_4_ = fVar3;
    auVar39._0_4_ = fVar3;
    auVar39._8_4_ = fVar3;
    auVar39._12_4_ = fVar3;
    auVar39._16_4_ = fVar3;
    auVar39._20_4_ = fVar3;
    auVar39._24_4_ = fVar3;
    auVar39._28_4_ = fVar3;
    fVar4 = (context->query_radius).field_0.m128[0];
    auVar46._4_4_ = fVar4;
    auVar46._0_4_ = fVar4;
    auVar46._8_4_ = fVar4;
    auVar46._12_4_ = fVar4;
    auVar46._16_4_ = fVar4;
    auVar46._20_4_ = fVar4;
    auVar46._24_4_ = fVar4;
    auVar46._28_4_ = fVar4;
    fVar5 = (context->query_radius).field_0.m128[1];
    auVar42._4_4_ = fVar5;
    auVar42._0_4_ = fVar5;
    auVar42._8_4_ = fVar5;
    auVar42._12_4_ = fVar5;
    auVar42._16_4_ = fVar5;
    auVar42._20_4_ = fVar5;
    auVar42._24_4_ = fVar5;
    auVar42._28_4_ = fVar5;
    fVar6 = (context->query_radius).field_0.m128[2];
    auVar44._4_4_ = fVar6;
    auVar44._0_4_ = fVar6;
    auVar44._8_4_ = fVar6;
    auVar44._12_4_ = fVar6;
    auVar44._16_4_ = fVar6;
    auVar44._20_4_ = fVar6;
    auVar44._24_4_ = fVar6;
    auVar44._28_4_ = fVar6;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar40 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar40 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    }
    puVar19 = local_2338;
    auVar46 = vsubps_avx(auVar37,auVar46);
    auVar41._0_4_ = fVar4 + fVar1;
    auVar41._4_4_ = fVar4 + fVar1;
    auVar41._8_4_ = fVar4 + fVar1;
    auVar41._12_4_ = fVar4 + fVar1;
    auVar41._16_4_ = fVar4 + fVar1;
    auVar41._20_4_ = fVar4 + fVar1;
    auVar41._24_4_ = fVar4 + fVar1;
    auVar41._28_4_ = fVar4 + fVar1;
    auVar42 = vsubps_avx(auVar38,auVar42);
    auVar43._0_4_ = fVar2 + fVar5;
    auVar43._4_4_ = fVar2 + fVar5;
    auVar43._8_4_ = fVar2 + fVar5;
    auVar43._12_4_ = fVar2 + fVar5;
    auVar43._16_4_ = fVar2 + fVar5;
    auVar43._20_4_ = fVar2 + fVar5;
    auVar43._24_4_ = fVar2 + fVar5;
    auVar43._28_4_ = fVar2 + fVar5;
    auVar44 = vsubps_avx(auVar39,auVar44);
    auVar45._0_4_ = fVar6 + fVar3;
    auVar45._4_4_ = fVar6 + fVar3;
    auVar45._8_4_ = fVar6 + fVar3;
    auVar45._12_4_ = fVar6 + fVar3;
    auVar45._16_4_ = fVar6 + fVar3;
    auVar45._20_4_ = fVar6 + fVar3;
    auVar45._24_4_ = fVar6 + fVar3;
    auVar45._28_4_ = fVar6 + fVar3;
    fVar4 = fVar4 * fVar4;
    auVar47._4_4_ = fVar4;
    auVar47._0_4_ = fVar4;
    auVar47._8_4_ = fVar4;
    auVar47._12_4_ = fVar4;
    auVar47._16_4_ = fVar4;
    auVar47._20_4_ = fVar4;
    auVar47._24_4_ = fVar4;
    auVar47._28_4_ = fVar4;
    auVar9 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar48._8_4_ = 0xfffffff8;
    auVar48._0_8_ = 0xfffffff8fffffff8;
    auVar48._12_4_ = 0xfffffff8;
    auVar48._16_4_ = 0xfffffff8;
    auVar48._20_4_ = 0xfffffff8;
    auVar48._24_4_ = 0xfffffff8;
    auVar48._28_4_ = 0xfffffff8;
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x303020108));
    auVar11 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
    auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x605040302010008));
    auVar26 = vpbroadcastd_avx512vl(ZEXT416(1));
    while (puVar19 != &local_2348) {
      bVar22 = (ulong *)0xf < puVar19;
      puVar19 = puVar19 + -2;
      vucomiss_avx512f(auVar40);
      if (bVar22 || puVar19 == (ulong *)0x0) {
        uVar24 = *puVar19;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar24 & 8) == 0) {
              uVar20 = uVar24 & 0xfffffffffffffff0;
              auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)query->time));
              auVar28 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x100),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0x40));
              auVar29 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x140),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0x80));
              auVar30 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x180),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0xc0));
              auVar31 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x120),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0x60));
              auVar32 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x160),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0xa0));
              auVar33 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar20 + 0x1a0),auVar27,
                                   *(undefined1 (*) [32])(uVar20 + 0xe0));
              auVar34 = vmaxps_avx512vl(auVar37,auVar28);
              auVar34 = vminps_avx512vl(auVar34,auVar31);
              auVar34 = vsubps_avx512vl(auVar34,auVar37);
              auVar29 = vmaxps_avx512vl(auVar38,auVar29);
              auVar29 = vminps_avx512vl(auVar29,auVar32);
              auVar29 = vsubps_avx512vl(auVar29,auVar38);
              auVar30 = vmaxps_avx512vl(auVar39,auVar30);
              auVar30 = vminps_avx512vl(auVar30,auVar33);
              auVar30 = vsubps_avx512vl(auVar30,auVar39);
              auVar32 = vmulps_avx512vl(auVar34,auVar34);
              auVar29 = vmulps_avx512vl(auVar29,auVar29);
              auVar29 = vaddps_avx512vl(auVar32,auVar29);
              auVar30 = vmulps_avx512vl(auVar30,auVar30);
              auVar29 = vaddps_avx512vl(auVar29,auVar30);
              in_ZMM18 = ZEXT3264(auVar29);
              uVar12 = vcmpps_avx512vl(auVar29,auVar47,2);
              uVar13 = vcmpps_avx512vl(auVar28,auVar31,2);
              bVar23 = (byte)uVar12 & (byte)uVar13;
              if (((uint)uVar24 & 7) == 6) {
                uVar12 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar20 + 0x1c0),0xd);
                uVar13 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
                bVar23 = (byte)uVar12 & (byte)uVar13 & bVar23;
              }
              This = (Intersectors *)CONCAT44((int)(uVar20 >> 0x20),(uint)bVar23);
            }
          }
          else if ((uVar24 & 8) == 0) {
            uVar20 = uVar24 & 0xfffffffffffffff0;
            auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)query->time));
            auVar28 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x100),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0x40));
            auVar29 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x140),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0x80));
            auVar30 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x180),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0xc0));
            auVar31 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x120),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0x60));
            auVar32 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x160),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0xa0));
            auVar33 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x1a0),auVar27,
                                 *(undefined1 (*) [32])(uVar20 + 0xe0));
            auVar34 = vmaxps_avx512vl(auVar37,auVar28);
            auVar34 = vminps_avx512vl(auVar34,auVar31);
            auVar34 = vsubps_avx512vl(auVar34,auVar37);
            auVar36 = vmaxps_avx512vl(auVar38,auVar29);
            auVar36 = vminps_avx512vl(auVar36,auVar32);
            auVar36 = vsubps_avx512vl(auVar36,auVar38);
            auVar35 = vmaxps_avx512vl(auVar39,auVar30);
            auVar35 = vminps_avx512vl(auVar35,auVar33);
            auVar35 = vsubps_avx512vl(auVar35,auVar39);
            auVar34 = vmulps_avx512vl(auVar34,auVar34);
            auVar36 = vmulps_avx512vl(auVar36,auVar36);
            auVar34 = vaddps_avx512vl(auVar34,auVar36);
            auVar36 = vmulps_avx512vl(auVar35,auVar35);
            auVar34 = vaddps_avx512vl(auVar34,auVar36);
            in_ZMM18 = ZEXT3264(auVar34);
            uVar12 = vcmpps_avx512vl(auVar28,auVar31,2);
            uVar13 = vcmpps_avx512vl(auVar31,auVar46,1);
            uVar14 = vcmpps_avx512vl(auVar28,auVar41,6);
            uVar15 = vcmpps_avx512vl(auVar32,auVar42,1);
            uVar16 = vcmpps_avx512vl(auVar29,auVar43,6);
            uVar17 = vcmpps_avx512vl(auVar33,auVar44,1);
            uVar18 = vcmpps_avx512vl(auVar30,auVar45,6);
            bVar23 = ~((byte)uVar16 | (byte)uVar14 | (byte)uVar18 | (byte)uVar13 |
                      (byte)uVar15 | (byte)uVar17) & (byte)uVar12;
            This = (Intersectors *)(ulong)bVar23;
            if (((uint)uVar24 & 7) == 6) {
              uVar12 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
              uVar13 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar20 + 0x1c0),0xd);
              This = (Intersectors *)(ulong)((byte)uVar12 & (byte)uVar13 & bVar23);
            }
          }
          bVar22 = false;
          if (((uVar24 & 8) == 0) && (bVar22 = false, This != (Intersectors *)0x0)) {
            auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar24 & 0xfffffffffffffff0));
            auVar28 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar24 & 0xfffffffffffffff0))[1]);
            auVar29 = vmovdqa64_avx512vl(auVar9);
            auVar32 = in_ZMM18._0_32_;
            auVar29 = vpternlogd_avx512vl(auVar29,auVar32,auVar48,0xf8);
            uVar24 = (ulong)This & 0xffffffff;
            auVar31 = vpcompressd_avx512vl(auVar29);
            bVar22 = (bool)((byte)uVar24 & 1);
            auVar30._0_4_ = (uint)bVar22 * auVar31._0_4_ | (uint)!bVar22 * auVar29._0_4_;
            bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
            auVar30._4_4_ = (uint)bVar22 * auVar31._4_4_ | (uint)!bVar22 * auVar29._4_4_;
            bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
            auVar30._8_4_ = (uint)bVar22 * auVar31._8_4_ | (uint)!bVar22 * auVar29._8_4_;
            bVar22 = (bool)((byte)(uVar24 >> 3) & 1);
            auVar30._12_4_ = (uint)bVar22 * auVar31._12_4_ | (uint)!bVar22 * auVar29._12_4_;
            bVar22 = (bool)((byte)(uVar24 >> 4) & 1);
            auVar30._16_4_ = (uint)bVar22 * auVar31._16_4_ | (uint)!bVar22 * auVar29._16_4_;
            bVar22 = (bool)((byte)(uVar24 >> 5) & 1);
            auVar30._20_4_ = (uint)bVar22 * auVar31._20_4_ | (uint)!bVar22 * auVar29._20_4_;
            bVar22 = (bool)((byte)(uVar24 >> 6) & 1);
            auVar30._24_4_ = (uint)bVar22 * auVar31._24_4_ | (uint)!bVar22 * auVar29._24_4_;
            bVar22 = (bool)((byte)(uVar24 >> 7) & 1);
            auVar30._28_4_ = (uint)bVar22 * auVar31._28_4_ | (uint)!bVar22 * auVar29._28_4_;
            auVar29 = vmovdqa64_avx512vl(auVar27);
            auVar29 = vpermt2q_avx512vl(auVar29,auVar30,auVar28);
            uVar24 = auVar29._0_8_;
            uVar20 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            bVar22 = true;
            if (uVar20 != 0) {
              auVar29 = vpshufd_avx512vl(auVar30,0x55);
              auVar31 = vmovdqa64_avx512vl(auVar27);
              vpermt2q_avx512vl(auVar31,auVar29,auVar28);
              auVar31 = vpminsd_avx512vl(auVar30,auVar29);
              auVar29 = vpmaxsd_avx512vl(auVar30,auVar29);
              uVar20 = uVar20 - 1 & uVar20;
              if (uVar20 == 0) {
                auVar30 = vpermi2q_avx512vl(auVar31,auVar27,auVar28);
                uVar24 = auVar30._0_8_;
                auVar27 = vpermt2q_avx512vl(auVar27,auVar29,auVar28);
                *puVar19 = auVar27._0_8_;
                auVar27 = vpermd_avx512vl(auVar29,auVar32);
                *(int *)(puVar19 + 1) = auVar27._0_4_;
                puVar19 = puVar19 + 2;
              }
              else {
                auVar33 = vpshufd_avx512vl(auVar30,0xaa);
                auVar34 = vmovdqa64_avx512vl(auVar27);
                vpermt2q_avx512vl(auVar34,auVar33,auVar28);
                auVar34 = vpminsd_avx512vl(auVar31,auVar33);
                auVar31 = vpmaxsd_avx512vl(auVar31,auVar33);
                auVar33 = vpminsd_avx512vl(auVar29,auVar31);
                auVar29 = vpmaxsd_avx512vl(auVar29,auVar31);
                uVar20 = uVar20 - 1 & uVar20;
                if (uVar20 == 0) {
                  auVar30 = vpermi2q_avx512vl(auVar34,auVar27,auVar28);
                  uVar24 = auVar30._0_8_;
                  auVar30 = vmovdqa64_avx512vl(auVar27);
                  auVar30 = vpermt2q_avx512vl(auVar30,auVar29,auVar28);
                  *puVar19 = auVar30._0_8_;
                  auVar29 = vpermd_avx512vl(auVar29,auVar32);
                  *(int *)(puVar19 + 1) = auVar29._0_4_;
                  auVar27 = vpermt2q_avx512vl(auVar27,auVar33,auVar28);
                  puVar19[2] = auVar27._0_8_;
                  auVar27 = vpermd_avx512vl(auVar33,auVar32);
                  *(int *)(puVar19 + 3) = auVar27._0_4_;
                  puVar19 = puVar19 + 4;
                }
                else {
                  auVar31 = vpshufd_avx512vl(auVar30,0xff);
                  auVar36 = vmovdqa64_avx512vl(auVar27);
                  vpermt2q_avx512vl(auVar36,auVar31,auVar28);
                  auVar36 = vpminsd_avx512vl(auVar34,auVar31);
                  auVar31 = vpmaxsd_avx512vl(auVar34,auVar31);
                  auVar34 = vpminsd_avx512vl(auVar33,auVar31);
                  auVar31 = vpmaxsd_avx512vl(auVar33,auVar31);
                  auVar33 = vpminsd_avx512vl(auVar29,auVar31);
                  auVar29 = vpmaxsd_avx512vl(auVar29,auVar31);
                  uVar20 = uVar20 - 1 & uVar20;
                  if (uVar20 == 0) {
                    auVar30 = vpermi2q_avx512vl(auVar36,auVar27,auVar28);
                    uVar24 = auVar30._0_8_;
                    auVar30 = vmovdqa64_avx512vl(auVar27);
                    auVar30 = vpermt2q_avx512vl(auVar30,auVar29,auVar28);
                    *puVar19 = auVar30._0_8_;
                    auVar29 = vpermd_avx512vl(auVar29,auVar32);
                    *(int *)(puVar19 + 1) = auVar29._0_4_;
                    auVar29 = vmovdqa64_avx512vl(auVar27);
                    auVar29 = vpermt2q_avx512vl(auVar29,auVar33,auVar28);
                    puVar19[2] = auVar29._0_8_;
                    auVar29 = vpermd_avx512vl(auVar33,auVar32);
                    *(int *)(puVar19 + 3) = auVar29._0_4_;
                    auVar27 = vpermt2q_avx512vl(auVar27,auVar34,auVar28);
                    puVar19[4] = auVar27._0_8_;
                    auVar27 = vpermd_avx512vl(auVar34,auVar32);
                    *(int *)(puVar19 + 5) = auVar27._0_4_;
                    puVar19 = puVar19 + 6;
                  }
                  else {
                    auVar31 = valignd_avx512vl(auVar30,auVar30,3);
                    auVar30 = vmovdqa64_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                    CONCAT48(0x80000000,
                                                                             0x8000000080000000))));
                    auVar30 = vpermt2d_avx512vl(auVar30,auVar10,auVar36);
                    auVar30 = vpermt2d_avx512vl(auVar30,auVar11,auVar34);
                    auVar30 = vpermt2d_avx512vl(auVar30,auVar11,auVar33);
                    auVar29 = vpermt2d_avx512vl(auVar30,auVar25,auVar29);
                    auVar49 = ZEXT3264(auVar29);
                    uVar24 = uVar20;
                    do {
                      auVar29 = vmovdqa64_avx512vl(auVar49._0_32_);
                      auVar30 = vpermd_avx512vl(auVar26,auVar31);
                      auVar31 = valignd_avx512vl(auVar31,auVar31,1);
                      auVar33 = vmovdqa64_avx512vl(auVar27);
                      vpermt2q_avx512vl(auVar33,auVar31,auVar28);
                      uVar24 = uVar24 - 1 & uVar24;
                      uVar12 = vpcmpd_avx512vl(auVar30,auVar29,5);
                      auVar30 = vpmaxsd_avx512vl(auVar30,auVar29);
                      bVar23 = (byte)uVar12 << 1;
                      auVar29 = valignd_avx512vl(auVar29,auVar29,7);
                      bVar8 = (bool)((byte)uVar12 & 1);
                      auVar33._4_4_ = (uint)bVar8 * auVar29._4_4_ | (uint)!bVar8 * auVar30._4_4_;
                      auVar33._0_4_ = auVar30._0_4_;
                      bVar8 = (bool)(bVar23 >> 2 & 1);
                      auVar33._8_4_ = (uint)bVar8 * auVar29._8_4_ | (uint)!bVar8 * auVar30._8_4_;
                      bVar8 = (bool)(bVar23 >> 3 & 1);
                      auVar33._12_4_ = (uint)bVar8 * auVar29._12_4_ | (uint)!bVar8 * auVar30._12_4_;
                      bVar8 = (bool)(bVar23 >> 4 & 1);
                      auVar33._16_4_ = (uint)bVar8 * auVar29._16_4_ | (uint)!bVar8 * auVar30._16_4_;
                      bVar8 = (bool)(bVar23 >> 5 & 1);
                      auVar33._20_4_ = (uint)bVar8 * auVar29._20_4_ | (uint)!bVar8 * auVar30._20_4_;
                      bVar8 = (bool)(bVar23 >> 6 & 1);
                      auVar33._24_4_ = (uint)bVar8 * auVar29._24_4_ | (uint)!bVar8 * auVar30._24_4_;
                      auVar33._28_4_ =
                           (uint)(bVar23 >> 7) * auVar29._28_4_ |
                           (uint)!(bool)(bVar23 >> 7) * auVar30._28_4_;
                      auVar49 = ZEXT3264(auVar33);
                    } while (uVar24 != 0);
                    lVar21 = POPCOUNT(uVar20) + 3;
                    auVar29 = vmovdqa64_avx512vl(auVar33);
                    do {
                      auVar29 = vpermi2q_avx512vl(auVar29,auVar27,auVar28);
                      *puVar19 = auVar29._0_8_;
                      auVar30 = auVar49._0_32_;
                      auVar29 = vpermd_avx512vl(auVar30,auVar32);
                      *(int *)(puVar19 + 1) = auVar29._0_4_;
                      auVar29 = valignd_avx512vl(auVar30,auVar30,1);
                      puVar19 = puVar19 + 2;
                      auVar30 = vmovdqa64_avx512vl(auVar29);
                      auVar49 = ZEXT3264(auVar30);
                      lVar21 = lVar21 + -1;
                    } while (lVar21 != 0);
                    auVar27 = vpermt2q_avx512vl(auVar27,auVar29,auVar28);
                    uVar24 = auVar27._0_8_;
                  }
                }
              }
            }
          }
        } while (bVar22);
      }
    }
  }
  return false;
}

Assistant:

bool BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::pointQuery(
      const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
    {
      return PointQueryDispatch<N, types, robust, PrimitiveIntersector1>::pointQuery(This, query, context);
    }